

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRuntimeDependencyArchive.cxx
# Opt level: O0

string * __thiscall
cmRuntimeDependencyArchive::GetBundleExecutable_abi_cxx11_
          (string *__return_storage_ptr__,cmRuntimeDependencyArchive *this)

{
  cmRuntimeDependencyArchive *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->BundleExecutable);
  return __return_storage_ptr__;
}

Assistant:

std::string cmRuntimeDependencyArchive::GetBundleExecutable()
{
  return this->BundleExecutable;
}